

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

int dlist_insl_end(dlist_head_t *head,dlist_t *dlist)

{
  dlist_t *dlist_local;
  dlist_head_t *head_local;
  
  if ((head == (dlist_head_t *)0x0) || (dlist == (dlist_t *)0x0)) {
    head_local._4_4_ = 0;
  }
  else if ((head->dlist == (dlist_s *)0x0) || (head->end == (dlist_s *)0x0)) {
    head->dlist = dlist;
    head->end = dlist;
    head->num = 1;
    head_local._4_4_ = 1;
  }
  else {
    head_local._4_4_ = dlist_insl_after(head,head->end,dlist);
  }
  return head_local._4_4_;
}

Assistant:

int dlist_insl_end(dlist_head_t *head,
      dlist_t *dlist) {
   if (!head || !dlist)
      return 0;

   if (!head->dlist || !head->end) {
      head->dlist = dlist;
      head->end  = dlist;
      head->num  = 1;
      return 1;
   } else {
      return dlist_insl_after(head, head->end, dlist);
   }
}